

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.h
# Opt level: O0

void __thiscall
spvtools::opt::SSAPropagator::SSAPropagator
          (SSAPropagator *this,IRContext *context,VisitFunction *visit_fn)

{
  VisitFunction *visit_fn_local;
  IRContext *context_local;
  SSAPropagator *this_local;
  
  this->ctx_ = context;
  std::
  function<spvtools::opt::SSAPropagator::PropStatus_(spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_**)>
  ::function(&this->visit_fn_,visit_fn);
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            ((queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
              *)&this->ssa_edge_uses_);
  std::
  queue<spvtools::opt::BasicBlock*,std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>
  ::queue<std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>,void>
            ((queue<spvtools::opt::BasicBlock*,std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>
              *)&this->blocks_);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::unordered_set(&this->simulated_blocks_);
  std::
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::unordered_set(&this->do_not_simulate_);
  std::
  unordered_map<spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>_>
  ::unordered_map(&this->bb_preds_);
  std::
  unordered_map<spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>_>
  ::unordered_map(&this->bb_succs_);
  std::
  set<spvtools::opt::Edge,_std::less<spvtools::opt::Edge>,_std::allocator<spvtools::opt::Edge>_>::
  set(&this->executable_edges_);
  std::
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::SSAPropagator::PropStatus,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::SSAPropagator::PropStatus>_>_>
  ::unordered_map(&this->statuses_);
  return;
}

Assistant:

SSAPropagator(IRContext* context, const VisitFunction& visit_fn)
      : ctx_(context), visit_fn_(visit_fn) {}